

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void ldamath::expdigammify<float,(lda_math_mode)1>
               (vw *all,float *gamma,float threshold,float initial)

{
  anon_class_8_2_969ef1a5 __unary_op;
  long lVar1;
  type tVar2;
  
  for (lVar1 = 0; (ulong)all->lda << 2 != lVar1; lVar1 = lVar1 + 4) {
    initial = initial + *(float *)((long)gamma + lVar1);
  }
  tVar2 = boost::math::digamma<float>(initial);
  __unary_op.threshold = threshold;
  __unary_op.sum = tVar2;
  std::
  transform<float*,float*,ldamath::expdigammify<float,(lda_math_mode)1>(vw&,float*,float,float)::_lambda(float)_1_>
            (gamma,gamma + all->lda,gamma,__unary_op);
  return;
}

Assistant:

inline void expdigammify(vw &all, T *gamma, T threshold, T initial)
{
  T sum = digamma<T, mtype>(std::accumulate(gamma, gamma + all.lda, initial));

  std::transform(gamma, gamma + all.lda, gamma,
      [sum, threshold](T g) { return fmax(threshold, exponential<T, mtype>(digamma<T, mtype>(g) - sum)); });
}